

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  String *other_00;
  String local_38;
  String *local_20;
  String *other_local;
  String *this_local;
  
  local_20 = other;
  other_local = this;
  this_local = __return_storage_ptr__;
  String(&local_38,this);
  other_00 = operator+=(&local_38,other);
  String(__return_storage_ptr__,other_00);
  ~String(&local_38);
  return __return_storage_ptr__;
}

Assistant:

String String::operator+(const String& other) const { return String(*this) += other; }